

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring64_bitmap_add_many(roaring64_bitmap_t *r,size_t n_args,uint64_t *vals)

{
  long in_RDX;
  uint64_t in_RSI;
  roaring64_bulk_context_t *in_RDI;
  uint64_t *current_val;
  roaring64_bulk_context_t context;
  uint64_t *end;
  long local_38;
  undefined1 local_30 [16];
  long local_20;
  long local_18;
  
  if (in_RSI != 0) {
    local_20 = in_RDX + in_RSI * 8;
    local_18 = in_RDX;
    memset(local_30,0,0x10);
    for (local_38 = local_18; local_38 != local_20; local_38 = local_38 + 8) {
      roaring64_bitmap_add_bulk((roaring64_bitmap_t *)current_val,in_RDI,in_RSI);
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_add_many(roaring64_bitmap_t *r, size_t n_args,
                               const uint64_t *vals) {
    if (n_args == 0) {
        return;
    }
    const uint64_t *end = vals + n_args;
    roaring64_bulk_context_t context = CROARING_ZERO_INITIALIZER;
    for (const uint64_t *current_val = vals; current_val != end;
         current_val++) {
        roaring64_bitmap_add_bulk(r, &context, *current_val);
    }
}